

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

duckdb_type duckdb_param_type(duckdb_prepared_statement prepared_statement,idx_t param_idx)

{
  duckdb_type dVar1;
  duckdb_logical_type logical_type;
  LogicalType *local_10;
  
  local_10 = (LogicalType *)duckdb_param_logical_type(prepared_statement,param_idx);
  if (local_10 == (LogicalType *)0x0) {
    dVar1 = DUCKDB_TYPE_INVALID;
  }
  else {
    dVar1 = duckdb::ConvertCPPTypeToC(local_10);
    duckdb_destroy_logical_type((duckdb_logical_type *)&local_10);
  }
  return dVar1;
}

Assistant:

duckdb_type duckdb_param_type(duckdb_prepared_statement prepared_statement, idx_t param_idx) {
	auto logical_type = duckdb_param_logical_type(prepared_statement, param_idx);
	if (!logical_type) {
		return DUCKDB_TYPE_INVALID;
	}

	auto type = duckdb_get_type_id(logical_type);

	duckdb_destroy_logical_type(&logical_type);

	return type;
}